

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::addInvocations(TranslateToFuzzReader *this,Function *func)

{
  pointer *pppEVar1;
  pointer *pppEVar2;
  TranslateToFuzzReader *pTVar3;
  Module *pMVar4;
  string_view target;
  Call *pCVar5;
  uint32_t uVar6;
  long *plVar7;
  char *pcVar8;
  long lVar9;
  Expression *pEVar10;
  Expression *pEVar11;
  uintptr_t *puVar12;
  Call *pCVar13;
  Type type;
  ulong extraout_RDX;
  pointer ppEVar14;
  MixedArena *this_00;
  Name NVar15;
  Name NVar16;
  Name name;
  undefined1 auVar17 [16];
  HeapType local_160;
  undefined1 auStack_158 [8];
  FunctionCreationContext context;
  Type local_b8;
  Expression *local_b0;
  Random *local_a8;
  Builder *local_a0;
  Function *local_98;
  HeapType *local_90;
  pointer *pppEStack_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invocations;
  Call *local_48;
  Expression *invoke;
  Function *local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> invoker;
  
  pcVar8 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  pppEVar1 = &invocations.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_98 = func;
  auStack_68 = (undefined1  [8])pppEVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_68,pcVar8,
             pcVar8 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  pppEVar2 = &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pppEStack_88 = pppEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pppEStack_88,"_invoker","");
  ppEVar14 = (pointer)0xf;
  if (auStack_68 != (undefined1  [8])pppEVar1) {
    ppEVar14 = invocations.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  }
  if (ppEVar14 <
      (pointer)((long)args.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start +
               (long)invocations.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
    ppEVar14 = (pointer)0xf;
    if (pppEStack_88 != pppEVar2) {
      ppEVar14 = args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    if ((pointer)((long)args.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                 (long)invocations.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) <= ppEVar14) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&pppEStack_88,0,(char *)0x0,(ulong)auStack_68);
      goto LAB_0014343a;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append(auStack_68,(ulong)pppEStack_88);
LAB_0014343a:
  auStack_158 = (undefined1  [8])&context.func;
  pTVar3 = (TranslateToFuzzReader *)(plVar7 + 2);
  if ((TranslateToFuzzReader *)*plVar7 == pTVar3) {
    context.func = (Function *)pTVar3->wasm;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (undefined4)plVar7[3];
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
  }
  else {
    context.func = (Function *)pTVar3->wasm;
    auStack_158 = (undefined1  [8])*plVar7;
  }
  context.parent = (TranslateToFuzzReader *)plVar7[1];
  *plVar7 = (long)pTVar3;
  plVar7[1] = 0;
  *(undefined1 *)&pTVar3->wasm = 0;
  auVar17 = ::wasm::IString::interned(context.parent,auStack_158,0);
  pcVar8 = auVar17._0_8_;
  if (auStack_158 != (undefined1  [8])&context.func) {
    operator_delete((void *)auStack_158,
                    (ulong)((long)&((context.func)->super_Importable).super_Named.name.super_IString
                                   .str._M_len + 1));
  }
  if (pppEStack_88 != pppEVar2) {
    operator_delete(pppEStack_88,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if (auStack_68 != (undefined1  [8])pppEVar1) {
    operator_delete((void *)auStack_68,
                    (long)invocations.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  NVar15.super_IString.str._M_str = pcVar8;
  NVar15.super_IString.str._M_len = (size_t)this->wasm;
  lVar9 = ::wasm::Module::getFunctionOrNull(NVar15);
  if (lVar9 == 0) {
    NVar16.super_IString.str._M_str = pcVar8;
    NVar16.super_IString.str._M_len = (size_t)this->wasm;
    lVar9 = ::wasm::Module::getExportOrNull(NVar16);
    if (lVar9 == 0) {
      ::wasm::HeapType::HeapType(&local_160,(Signature)ZEXT816(0));
      auStack_158 = (undefined1  [8])0x0;
      context.parent = (TranslateToFuzzReader *)0x0;
      context.func = (Function *)0x0;
      name.super_IString.str._M_str = pcVar8;
      name.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeFunction
                (name,(HeapType)auVar17._8_8_,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_160.id,
                 (Expression *)auStack_158);
      if (auStack_158 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_158,(long)context.func - (long)auStack_158);
      }
      this_00 = &((this->builder).wasm)->allocator;
      pEVar10 = (Expression *)MixedArena::allocSpace(this_00,0x40,8);
      pEVar10->_id = BlockId;
      (pEVar10->type).id = 0;
      *(undefined8 *)(pEVar10 + 1) = 0;
      pEVar10[1].type.id = 0;
      *(undefined8 *)(pEVar10 + 2) = 0;
      pEVar10[2].type.id = 0;
      *(undefined8 *)(pEVar10 + 3) = 0;
      pEVar10[3].type.id = (uintptr_t)this_00;
      local_38->body = pEVar10;
      FunctionCreationContext::FunctionCreationContext
                ((FunctionCreationContext *)auStack_158,this,local_38);
      local_a0 = &this->builder;
      auStack_68 = (undefined1  [8])0x0;
      invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8 = &this->random;
      local_90 = &local_98->type;
      while( true ) {
        uVar6 = Random::upTo(local_a8,2);
        if ((uVar6 != 0) || ((this->random).finishedInput != false)) break;
        pppEStack_88 = (pointer *)0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.id = ::wasm::HeapType::getSignature();
        invoke = (Expression *)0x0;
        local_48 = (Call *)&local_b8;
        pEVar11 = (Expression *)Type::size(&local_b8);
        if (invoke == pEVar11) goto LAB_001436c7;
        do {
          do {
            puVar12 = (uintptr_t *)
                      ::wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_b0 = makeConst(this,(Type)*puVar12);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&pppEStack_88,
                       &local_b0);
            invoke = (Expression *)&invoke->field_0x1;
          } while (invoke != pEVar11);
LAB_001436c7:
        } while (local_48 != (Call *)&local_b8);
        target = (local_98->super_Importable).super_Named.name.super_IString.str;
        ::wasm::HeapType::getSignature();
        local_48 = Builder::makeCall(local_a0,(Name)target,
                                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      *)&pppEStack_88,type,false);
        ::wasm::HeapType::getSignature();
        pCVar5 = local_48;
        if (1 < extraout_RDX) {
          pCVar13 = (Call *)MixedArena::allocSpace(&local_a0->wasm->allocator,0x18,8);
          (pCVar13->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id = DropId
          ;
          (pCVar13->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 0;
          (pCVar13->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
               (Expression **)pCVar5;
          ::wasm::Drop::finalize();
          local_48 = pCVar13;
        }
        if (invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     (iterator)
                     invocations.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start = (Expression *)local_48;
          invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               invocations.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        if ((this->hashMemoryName).super_IString.str._M_str != (char *)0x0) {
          uVar6 = Random::upTo(local_a8,2);
          if (uVar6 == 0) {
            local_b8.id = (uintptr_t)makeMemoryHashLogging(this);
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            emplace_back<wasm::Expression*>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                       (Expression **)&local_b8);
          }
        }
        if (pppEStack_88 != (pointer *)0x0) {
          operator_delete(pppEStack_88,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pppEStack_88);
        }
      }
      if (auStack_68 !=
          (undefined1  [8])
          invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
        set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                  ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
                   (pEVar10 + 2),
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68);
        ::wasm::Module::addFunction((unique_ptr *)this->wasm);
        if (this->preserveImportsAndExports == false) {
          pMVar4 = this->wasm;
          pppEStack_88 = (pointer *)operator_new(0x30);
          *(undefined1 (*) [16])(pppEStack_88 + 3) = auVar17;
          *(undefined1 (*) [16])pppEStack_88 = auVar17;
          *(undefined4 *)(pppEStack_88 + 2) = 0;
          *(undefined1 *)(pppEStack_88 + 5) = 0;
          ::wasm::Module::addExport((unique_ptr *)pMVar4);
          if (pppEStack_88 != (pointer *)0x0) {
            operator_delete(pppEStack_88,0x30);
          }
        }
      }
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)invocations.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)auStack_158);
      if (local_38 != (Function *)0x0) {
        std::default_delete<wasm::Function>::operator()
                  ((default_delete<wasm::Function> *)&local_38,local_38);
      }
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addInvocations(Function* func) {
  Name name = func->name.toString() + std::string("_invoker");
  if (wasm.getFunctionOrNull(name) || wasm.getExportOrNull(name)) {
    return;
  }
  auto invoker = builder.makeFunction(name, Signature(), {});
  Block* body = builder.makeBlock();
  invoker->body = body;
  FunctionCreationContext context(*this, invoker.get());
  std::vector<Expression*> invocations;
  while (oneIn(2) && !random.finished()) {
    std::vector<Expression*> args;
    for (const auto& type : func->getParams()) {
      args.push_back(makeConst(type));
    }
    Expression* invoke = builder.makeCall(func->name, args, func->getResults());
    if (func->getResults().isConcrete()) {
      invoke = builder.makeDrop(invoke);
    }
    invocations.push_back(invoke);
    // log out memory in some cases
    if (hashMemoryName && oneIn(2)) {
      invocations.push_back(makeMemoryHashLogging());
    }
  }
  if (invocations.empty()) {
    return;
  }
  body->list.set(invocations);
  wasm.addFunction(std::move(invoker));

  // Most of the benefit of invocations is lost when we do not add exports for
  // them, but still, they might be called by existing functions.
  if (!preserveImportsAndExports) {
    wasm.addExport(builder.makeExport(name, name, ExternalKind::Function));
  }
}